

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O0

void cmQtAutoGeneratorInitializer::InitializeAutogenSources(cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  undefined1 local_90 [8];
  string mocCppFile;
  string automocTargetName;
  allocator local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *makefile;
  cmGeneratorTarget *target_local;
  
  makefile = (cmMakefile *)target;
  local_18 = cmTarget::GetMakefile(target->Target);
  pcVar1 = makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"AUTOMOC",&local_39);
  bVar2 = cmGeneratorTarget::GetPropertyAsBool((cmGeneratorTarget *)pcVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (bVar2) {
    GetAutogenTargetName_abi_cxx11_
              ((string *)((long)&mocCppFile.field_2 + 8),(cmGeneratorTarget *)makefile);
    pcVar3 = cmMakefile::GetCurrentBinaryDirectory(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_90,pcVar3,&local_91);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::operator+=((string *)local_90,"/");
    std::__cxx11::string::operator+=
              ((string *)local_90,(string *)(mocCppFile.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_90,".cpp");
    cmMakefile::GetOrCreateSource(local_18,(string *)local_90,true);
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,"ADDITIONAL_MAKE_CLEAN_FILES",&local_b9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AppendProperty(pcVar1,&local_b8,pcVar3,false);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    cmGeneratorTarget::AddSource((cmGeneratorTarget *)makefile,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)(mocCppFile.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmQtAutoGeneratorInitializer::InitializeAutogenSources(
    cmGeneratorTarget* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();

  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    std::string automocTargetName = GetAutogenTargetName(target);
    std::string mocCppFile = makefile->GetCurrentBinaryDirectory();
    mocCppFile += "/";
    mocCppFile += automocTargetName;
    mocCppFile += ".cpp";
    makefile->GetOrCreateSource(mocCppFile, true);
    makefile->AppendProperty("ADDITIONAL_MAKE_CLEAN_FILES",
                            mocCppFile.c_str(), false);

    target->AddSource(mocCppFile);
    }
}